

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qkeysequenceedit.cpp
# Opt level: O2

void QKeySequenceEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QArrayDataPointer<QKeyCombination> *this;
  Data *pDVar1;
  bool bVar2;
  qsizetype count;
  QKeySequence *keySequence;
  long in_FS_OFFSET;
  QArrayDataPointer<QKeyCombination> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        editingFinished((QKeySequenceEdit *)_o);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        keySequenceChanged((QKeySequenceEdit *)_o,(QKeySequence *)_a[1]);
        return;
      }
      break;
    case 2:
      keySequence = (QKeySequence *)_a[1];
switchD_003e137a_caseD_0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setKeySequence((QKeySequenceEdit *)_o,keySequence);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        clear((QKeySequenceEdit *)_o);
        return;
      }
      break;
    case 4:
      count = *_a[1];
LAB_003e14c4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setMaximumSequenceLength((QKeySequenceEdit *)_o,count);
        return;
      }
      break;
    default:
      goto switchD_003e131c_caseD_3;
    }
    goto LAB_003e1548;
  case ReadProperty:
    if ((uint)_id < 4) {
      this = (QArrayDataPointer<QKeyCombination> *)*_a;
      switch(_id) {
      case 0:
        QKeySequenceEdit::keySequence((QKeySequenceEdit *)&local_30);
        pDVar1 = this->d;
        this->d = local_30.d;
        local_30.d = pDVar1;
        QKeySequence::~QKeySequence((QKeySequence *)&local_30);
        break;
      case 1:
        bVar2 = isClearButtonEnabled((QKeySequenceEdit *)_o);
        *(bool *)&this->d = bVar2;
        break;
      case 2:
        this->d = (Data *)(long)*(int *)(*(long *)(_o + 8) + 0x26c);
        break;
      case 3:
        finishingKeyCombinations((QList<QKeyCombination> *)&local_30,(QKeySequenceEdit *)_o);
        QArrayDataPointer<QKeyCombination>::operator=(this,&local_30);
        QArrayDataPointer<QKeyCombination>::~QArrayDataPointer(&local_30);
      }
    }
    break;
  case WriteProperty:
    if ((uint)_id < 4) {
      keySequence = (QKeySequence *)*_a;
      switch(_id) {
      case 0:
        goto switchD_003e137a_caseD_0;
      case 1:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setClearButtonEnabled((QKeySequenceEdit *)_o,(bool)*keySequence);
          return;
        }
        break;
      case 2:
        count = *(qsizetype *)keySequence;
        goto LAB_003e14c4;
      case 3:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          setFinishingKeyCombinations((QKeySequenceEdit *)_o,(QList<QKeyCombination> *)keySequence);
          return;
        }
      }
      goto LAB_003e1548;
    }
    break;
  case IndexOfMethod:
    bVar2 = QtMocHelpers::indexOfMethod<void(QKeySequenceEdit::*)()>
                      ((QtMocHelpers *)_a,(void **)editingFinished,0,0);
    if (!bVar2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QtMocHelpers::indexOfMethod<void(QKeySequenceEdit::*)(QKeySequence_const&)>
                  ((QtMocHelpers *)_a,(void **)keySequenceChanged,0,1);
        return;
      }
      goto LAB_003e1548;
    }
  }
switchD_003e131c_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_003e1548:
  __stack_chk_fail();
}

Assistant:

void QKeySequenceEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QKeySequenceEdit *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->editingFinished(); break;
        case 1: _t->keySequenceChanged((*reinterpret_cast< std::add_pointer_t<QKeySequence>>(_a[1]))); break;
        case 2: _t->setKeySequence((*reinterpret_cast< std::add_pointer_t<QKeySequence>>(_a[1]))); break;
        case 3: _t->clear(); break;
        case 4: _t->setMaximumSequenceLength((*reinterpret_cast< std::add_pointer_t<qsizetype>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QKeySequenceEdit::*)()>(_a, &QKeySequenceEdit::editingFinished, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QKeySequenceEdit::*)(const QKeySequence & )>(_a, &QKeySequenceEdit::keySequenceChanged, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QKeySequence*>(_v) = _t->keySequence(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isClearButtonEnabled(); break;
        case 2: *reinterpret_cast<qsizetype*>(_v) = _t->maximumSequenceLength(); break;
        case 3: *reinterpret_cast<QList<QKeyCombination>*>(_v) = _t->finishingKeyCombinations(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setKeySequence(*reinterpret_cast<QKeySequence*>(_v)); break;
        case 1: _t->setClearButtonEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setMaximumSequenceLength(*reinterpret_cast<qsizetype*>(_v)); break;
        case 3: _t->setFinishingKeyCombinations(*reinterpret_cast<QList<QKeyCombination>*>(_v)); break;
        default: break;
        }
    }
}